

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O3

void av1_tpl_rdmult_setup_sb(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE sb_size,int mi_row,int mi_col)

{
  FRAME_TYPE frame_type;
  aom_enc_pass aVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  int iVar5;
  AV1_PRIMARY *pAVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  byte bVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  int layer_depth;
  long lVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  pAVar6 = cpi->ppi;
  bVar12 = cpi->gf_frame_index;
  iVar8 = (pAVar6->p_rc).gfu_boost;
  iVar5 = 0xf;
  if (iVar8 < 0x640) {
    iVar5 = iVar8 / 100;
  }
  iVar8 = (pAVar6->gf_group).layer_depth[bVar12];
  layer_depth = 6;
  if (iVar8 < 6) {
    layer_depth = iVar8;
  }
  if ((((bVar12 < 0x60) &&
       (*(char *)((long)((pAVar6->tpl_data).tpl_frame)->ref_map_index +
                 ((ulong)((uint)bVar12 * 0x60) - 0x20)) != '\0')) &&
      (bVar12 = (pAVar6->gf_group).update_type[bVar12], bVar12 < 4)) &&
     ((bVar12 != 1 && ((cpi->oxcf).q_cfg.aq_mode == '\0')))) {
    uVar13 = (uint)(cpi->common).superres_scale_denominator;
    iVar18 = mi_col * uVar13;
    iVar19 = iVar18 + 4;
    iVar4 = (cpi->common).mi_params.mi_rows;
    uVar10 = (cpi->common).superres_upscaled_width + 7 >> 2 & 0xfffffffe;
    iVar8 = uVar10 + 3;
    iVar11 = uVar10 + 6;
    if (-1 < iVar8) {
      iVar11 = iVar8;
    }
    iVar11 = iVar11 >> 2;
    iVar8 = iVar4 + 3;
    iVar4 = iVar4 + 6;
    if (-1 < iVar8) {
      iVar4 = iVar8;
    }
    uVar10 = (("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[sb_size]
               * uVar13 + 4 & 0xffff) >> 3) + 3 >> 2;
    iVar8 = mi_row + 3;
    if (-1 < mi_row) {
      iVar8 = mi_row;
    }
    iVar8 = iVar8 >> 2;
    iVar14 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[sb_size]
              + 3 >> 2) + iVar8;
    if (iVar4 >> 2 < iVar14) {
      iVar14 = iVar4 >> 2;
    }
    frame_type = (cpi->common).current_frame.frame_type;
    lVar9 = (long)iVar11;
    if (iVar8 < iVar14) {
      iVar4 = iVar18 + 0x23;
      if (-1 < iVar19) {
        iVar4 = iVar19;
      }
      iVar4 = iVar4 >> 5;
      iVar7 = iVar4 + uVar10;
      if (iVar11 < iVar7) {
        iVar7 = iVar11;
      }
      lVar16 = (long)iVar8;
      lVar17 = lVar16 * lVar9 + (long)iVar4;
      dVar22 = 0.0;
      dVar23 = 0.0;
      do {
        lVar15 = lVar17;
        lVar20 = (long)iVar7 - (long)iVar4;
        if (iVar4 < iVar7) {
          do {
            dVar21 = log(cpi->tpl_rdmult_scaling_factors[lVar15]);
            dVar23 = dVar23 + dVar21;
            dVar22 = dVar22 + 1.0;
            lVar20 = lVar20 + -1;
            lVar15 = lVar15 + 1;
          } while (lVar20 != 0);
        }
        lVar16 = lVar16 + 1;
        lVar17 = lVar17 + lVar9;
      } while (lVar16 != iVar14);
      pAVar6 = cpi->ppi;
      bVar12 = (pAVar6->gf_group).update_type[cpi->gf_frame_index];
    }
    else {
      dVar23 = 0.0;
      dVar22 = 0.0;
    }
    aVar1 = (cpi->oxcf).pass;
    uVar13 = 1;
    if (((aVar1 < AOM_RC_LAST_PASS) && (uVar13 = 0, aVar1 == AOM_RC_ONE_PASS)) &&
       (cpi->compressor_stage == '\0')) {
      uVar13 = (uint)(pAVar6->lap_enabled != 0);
    }
    iVar4 = av1_compute_rd_mult((cpi->common).quant_params.y_dc_delta_q +
                                (cpi->common).quant_params.base_qindex,
                                ((cpi->common).seq_params)->bit_depth,bVar12,layer_depth,iVar5,
                                frame_type,(cpi->oxcf).q_cfg.use_fixed_qp_offsets,uVar13,
                                (cpi->oxcf).tune_cfg.tuning);
    aVar1 = (cpi->oxcf).pass;
    uVar13 = 1;
    if (((aVar1 < AOM_RC_LAST_PASS) && (uVar13 = 0, aVar1 == AOM_RC_ONE_PASS)) &&
       (cpi->compressor_stage == '\0')) {
      uVar13 = (uint)(cpi->ppi->lap_enabled != 0);
    }
    iVar5 = av1_compute_rd_mult(x->rdmult_delta_qindex + (cpi->common).quant_params.base_qindex +
                                (cpi->common).quant_params.y_dc_delta_q,
                                ((cpi->common).seq_params)->bit_depth,
                                (cpi->ppi->gf_group).update_type[cpi->gf_frame_index],layer_depth,
                                iVar5,frame_type,(cpi->oxcf).q_cfg.use_fixed_qp_offsets,uVar13,
                                (cpi->oxcf).tune_cfg.tuning);
    dVar21 = log((double)iVar5 / (double)iVar4);
    dVar21 = dVar21 - dVar23 / dVar22;
    if (dVar21 <= 700.0) {
      dVar23 = 0.0;
      if (-700.0 <= dVar21) {
        dVar23 = exp(dVar21);
      }
    }
    else {
      dVar23 = 1.79769313486232e+308;
    }
    if (iVar8 < iVar14) {
      iVar5 = iVar18 + 0x23;
      if (-1 < iVar19) {
        iVar5 = iVar19;
      }
      lVar16 = (long)iVar8;
      iVar5 = iVar5 >> 5;
      iVar8 = uVar10 + iVar5;
      if (iVar11 < iVar8) {
        iVar8 = iVar11;
      }
      lVar17 = lVar16 * lVar9 * 8;
      do {
        if (iVar5 < iVar8) {
          pdVar2 = cpi->tpl_rdmult_scaling_factors;
          pdVar3 = cpi->ppi->tpl_sb_rdmult_scaling_factors;
          lVar15 = (long)iVar5;
          do {
            *(double *)((long)pdVar3 + lVar15 * 8 + lVar17) =
                 *(double *)((long)pdVar2 + lVar15 * 8 + lVar17) * dVar23;
            lVar15 = lVar15 + 1;
          } while (iVar8 != lVar15);
        }
        lVar16 = lVar16 + 1;
        lVar17 = lVar17 + lVar9 * 8;
      } while (lVar16 != iVar14);
    }
  }
  return;
}

Assistant:

void av1_tpl_rdmult_setup_sb(AV1_COMP *cpi, MACROBLOCK *const x,
                             BLOCK_SIZE sb_size, int mi_row, int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;

  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;

  if (tpl_idx >= MAX_TPL_FRAME_IDX) return;
  TplDepFrame *tpl_frame = &cpi->ppi->tpl_data.tpl_frame[tpl_idx];
  if (!tpl_frame->is_valid) return;
  if (!is_frame_tpl_eligible(gf_group, cpi->gf_frame_index)) return;
  if (cpi->oxcf.q_cfg.aq_mode != NO_AQ) return;

  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);
  const int sb_mi_width_sr = coded_to_superres_mi(
      mi_size_wide[sb_size], cm->superres_scale_denominator);

  const int bsize_base = BLOCK_16X16;
  const int num_mi_w = mi_size_wide[bsize_base];
  const int num_mi_h = mi_size_high[bsize_base];
  const int num_cols = (mi_cols_sr + num_mi_w - 1) / num_mi_w;
  const int num_rows = (cm->mi_params.mi_rows + num_mi_h - 1) / num_mi_h;
  const int num_bcols = (sb_mi_width_sr + num_mi_w - 1) / num_mi_w;
  const int num_brows = (mi_size_high[sb_size] + num_mi_h - 1) / num_mi_h;
  int row, col;

  double base_block_count = 0.0;
  double log_sum = 0.0;

  for (row = mi_row / num_mi_w;
       row < num_rows && row < mi_row / num_mi_w + num_brows; ++row) {
    for (col = mi_col_sr / num_mi_h;
         col < num_cols && col < mi_col_sr / num_mi_h + num_bcols; ++col) {
      const int index = row * num_cols + col;
      log_sum += log(cpi->tpl_rdmult_scaling_factors[index]);
      base_block_count += 1.0;
    }
  }

  const CommonQuantParams *quant_params = &cm->quant_params;

  const int orig_qindex_rdmult =
      quant_params->base_qindex + quant_params->y_dc_delta_q;
  const int orig_rdmult = av1_compute_rd_mult(
      orig_qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

  const int new_qindex_rdmult = quant_params->base_qindex +
                                x->rdmult_delta_qindex +
                                quant_params->y_dc_delta_q;
  const int new_rdmult = av1_compute_rd_mult(
      new_qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

  const double scaling_factor = (double)new_rdmult / (double)orig_rdmult;

  double scale_adj = log(scaling_factor) - log_sum / base_block_count;
  scale_adj = exp_bounded(scale_adj);

  for (row = mi_row / num_mi_w;
       row < num_rows && row < mi_row / num_mi_w + num_brows; ++row) {
    for (col = mi_col_sr / num_mi_h;
         col < num_cols && col < mi_col_sr / num_mi_h + num_bcols; ++col) {
      const int index = row * num_cols + col;
      cpi->ppi->tpl_sb_rdmult_scaling_factors[index] =
          scale_adj * cpi->tpl_rdmult_scaling_factors[index];
    }
  }
}